

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvgrast.h
# Opt level: O2

void nsvg__initPaint(NSVGcachedPaint *cache,NSVGpaint *paint,float opacity)

{
  char cVar1;
  NSVGgradient *pNVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int iVar13;
  undefined1 auVar12 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  int local_64;
  long local_48;
  
  cVar1 = paint->type;
  cache->type = cVar1;
  if (cVar1 == '\x01') {
    uVar4 = nsvg__applyOpacity((paint->field_1).color,opacity);
    cache->colors[0] = uVar4;
  }
  else {
    pNVar2 = (paint->field_1).gradient;
    cache->spread = pNVar2->spread;
    *(undefined8 *)(cache->xform + 4) = *(undefined8 *)(pNVar2->xform + 4);
    uVar3 = *(undefined8 *)(pNVar2->xform + 2);
    *(undefined8 *)cache->xform = *(undefined8 *)pNVar2->xform;
    *(undefined8 *)(cache->xform + 2) = uVar3;
    iVar13 = pNVar2->nstops;
    if (iVar13 == 0) {
      for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 1) {
        cache->colors[lVar6] = 0;
      }
      iVar13 = pNVar2->nstops;
    }
    if (iVar13 == 1) {
      for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 1) {
        uVar4 = nsvg__applyOpacity(pNVar2->stops[lVar6].color,opacity);
        cache->colors[lVar6] = uVar4;
      }
    }
    else {
      uVar4 = nsvg__applyOpacity(pNVar2->stops[0].color,opacity);
      fVar15 = pNVar2->stops[0].offset;
      fVar14 = 1.0;
      if (fVar15 <= 1.0) {
        fVar14 = fVar15;
      }
      fVar14 = (float)(~-(uint)(fVar15 < 0.0) & (uint)fVar14);
      fVar15 = pNVar2->stops[(long)iVar13 + -1].offset;
      fVar16 = 1.0;
      if (fVar15 <= 1.0) {
        fVar16 = fVar15;
      }
      uVar7 = 0;
      uVar9 = (ulong)(uint)(int)(fVar14 * 255.0);
      if ((int)(fVar14 * 255.0) < 1) {
        uVar9 = uVar7;
      }
      for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
        cache->colors[uVar7] = uVar4;
      }
      local_64 = (int)((float)(~-(uint)(fVar15 < fVar14) & (uint)fVar16 |
                              -(uint)(fVar15 < fVar14) & (uint)fVar14) * 255.0);
      local_48 = 0;
      uVar4 = 0;
      lVar6 = local_48;
      while (local_48 = lVar6, local_48 < (long)pNVar2->nstops + -1) {
        uVar4 = nsvg__applyOpacity((uint)pNVar2[1].xform[local_48 * 2],opacity);
        fVar15 = pNVar2->stops[local_48].offset;
        fVar14 = pNVar2[1].stops[local_48 + -5].offset;
        auVar12._4_4_ = fVar15;
        auVar12._0_4_ = fVar14;
        auVar12._8_8_ = 0;
        auVar12 = minps(_DAT_00123780,auVar12);
        local_64 = (int)(float)(-(uint)(0.0 <= fVar14) & (uint)(auVar12._0_4_ * 255.0));
        iVar13 = (int)(float)(-(uint)(0.0 <= fVar15) & (uint)(auVar12._4_4_ * 255.0));
        uVar8 = local_64 - iVar13;
        lVar6 = local_48 + 1;
        if (uVar8 != 0 && iVar13 <= local_64) {
          uVar5 = nsvg__applyOpacity(pNVar2->stops[local_48].color,opacity);
          fVar15 = 0.0;
          for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
            fVar14 = 1.0;
            if (fVar15 <= 1.0) {
              fVar14 = fVar15;
            }
            iVar11 = (int)(float)(~-(uint)(fVar15 < 0.0) & (uint)(fVar14 * 256.0));
            iVar10 = 0x100 - iVar11;
            cache->colors[(long)iVar13 + uVar9] =
                 (iVar11 * (uVar4 >> 0x18) + iVar10 * (uVar5 >> 0x18) & 0xff00) << 0x10 |
                 ((uVar4 >> 0x10 & 0xff) * iVar11 + iVar10 * (uVar5 >> 0x10 & 0xff) & 0xff00) << 8 |
                 (uVar4 >> 8 & 0xff) * iVar11 + iVar10 * (uVar5 >> 8 & 0xff) & 0xff00 |
                 (uVar4 & 0xff) * iVar11 + iVar10 * (uVar5 & 0xff) >> 8 & 0xff;
            fVar15 = fVar15 + 1.0 / (float)(int)uVar8;
          }
        }
      }
      for (lVar6 = (long)local_64; lVar6 < 0x100; lVar6 = lVar6 + 1) {
        cache->colors[lVar6] = uVar4;
      }
    }
  }
  return;
}

Assistant:

static void nsvg__initPaint(NSVGcachedPaint* cache, NSVGpaint* paint, float opacity)
{
	int i, j;
	NSVGgradient* grad;

	cache->type = paint->type;

	if (paint->type == NSVG_PAINT_COLOR) {
		cache->colors[0] = nsvg__applyOpacity(paint->color, opacity);
		return;
	}

	grad = paint->gradient;

	cache->spread = grad->spread;
	memcpy(cache->xform, grad->xform, sizeof(float)*6);

	if (grad->nstops == 0) {
		for (i = 0; i < 256; i++)
			cache->colors[i] = 0;
	} if (grad->nstops == 1) {
		for (i = 0; i < 256; i++)
			cache->colors[i] = nsvg__applyOpacity(grad->stops[i].color, opacity);
	} else {
		unsigned int ca, cb = 0;
		float ua, ub, du, u;
		int ia, ib, count;

		ca = nsvg__applyOpacity(grad->stops[0].color, opacity);
		ua = nsvg__clampf(grad->stops[0].offset, 0, 1);
		ub = nsvg__clampf(grad->stops[grad->nstops-1].offset, ua, 1);
		ia = (int)(ua * 255.0f);
		ib = (int)(ub * 255.0f);
		for (i = 0; i < ia; i++) {
			cache->colors[i] = ca;
		}

		for (i = 0; i < grad->nstops-1; i++) {
			ca = nsvg__applyOpacity(grad->stops[i].color, opacity);
			cb = nsvg__applyOpacity(grad->stops[i+1].color, opacity);
			ua = nsvg__clampf(grad->stops[i].offset, 0, 1);
			ub = nsvg__clampf(grad->stops[i+1].offset, 0, 1);
			ia = (int)(ua * 255.0f);
			ib = (int)(ub * 255.0f);
			count = ib - ia;
			if (count <= 0) continue;
			u = 0;
			du = 1.0f / (float)count;
			for (j = 0; j < count; j++) {
				cache->colors[ia+j] = nsvg__lerpRGBA(ca,cb,u);
				u += du;
			}
		}

		for (i = ib; i < 256; i++)
			cache->colors[i] = cb;
	}

}